

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_Expressions.cpp
# Opt level: O2

bool __thiscall
psy::C::Parser::parseExpressionWithPrecedenceUnary(Parser *this,ExpressionSyntax **expr)

{
  bool bVar1;
  SyntaxToken *pSVar2;
  ParseOptions *this_00;
  LanguageExtensions *this_01;
  code *parseOperand;
  SyntaxKind SVar3;
  allocator<char> local_39;
  string local_38;
  
  pSVar2 = peek(this,1);
  SVar3 = pSVar2->syntaxK_;
  switch(SVar3) {
  case PlusPlusToken:
    parseOperand = parseExpressionWithPrecedenceUnary;
    SVar3 = PreIncrementExpression;
    break;
  case MinusMinusToken:
    parseOperand = parseExpressionWithPrecedenceUnary;
    SVar3 = PreDecrementExpression;
    break;
  case AsteriskToken:
    parseOperand = parseExpressionWithPrecedenceCast;
    SVar3 = PointerIndirectionExpression;
    break;
  case AmpersandToken:
    parseOperand = parseExpressionWithPrecedenceCast;
    SVar3 = AddressOfExpression;
    break;
  case PlusToken:
    parseOperand = parseExpressionWithPrecedenceCast;
    SVar3 = UnaryPlusExpression;
    break;
  case MinusToken:
    parseOperand = parseExpressionWithPrecedenceCast;
    SVar3 = UnaryMinusExpression;
    break;
  case OperatorName_COMPLToken:
    parseOperand = parseExpressionWithPrecedenceCast;
    SVar3 = BitwiseNotExpression;
    break;
  case SlashToken:
  case PercentToken:
  case LessThanLessThanToken:
  case GreaterThanGreaterThanToken:
  case BarToken:
  case CaretToken:
switchD_002f1b1f_caseD_48:
    bVar1 = parseExpressionWithPrecedencePostfix(this,expr);
    return bVar1;
  case ExclamationToken:
    parseOperand = parseExpressionWithPrecedenceCast;
    SVar3 = LogicalNotExpression;
    break;
  case AmpersandAmpersandToken:
    this_00 = SyntaxTree::parseOptions(this->tree_);
    this_01 = ParseOptions::languageExtensions(this_00);
    bVar1 = LanguageExtensions::isEnabled_extGNU_LabelsAsValues(this_01);
    if (!bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"GNU labels as values",&local_39);
      DiagnosticsReporter::ExpectedFeature(&this->diagReporter_,&local_38);
      std::__cxx11::string::~string((string *)&local_38);
    }
    bVar1 = parsePrefixUnaryExpression_AtFirst(this,expr,ExtGNU_LabelAddress,0x2f1e1e);
    return bVar1;
  default:
    if (SVar3 == Keyword_sizeof) {
      SVar3 = SizeofExpression;
    }
    else {
      if (SVar3 != KeywordAlias___alignof) goto switchD_002f1b1f_caseD_48;
      SVar3 = AlignofExpression;
    }
    bVar1 = parseTypeTraitExpression_AtFirst(this,expr,SVar3);
    return bVar1;
  }
  bVar1 = parsePrefixUnaryExpression_AtFirst(this,expr,SVar3,(offset_in_Parser_to_subr)parseOperand)
  ;
  return bVar1;
}

Assistant:

bool Parser::parseExpressionWithPrecedenceUnary(ExpressionSyntax*& expr)
{
    DBG_THIS_RULE();

    switch (peek().kind()) {
        /* 6.5.3.1 */
        case SyntaxKind::PlusPlusToken:
            return parsePrefixUnaryExpression_AtFirst(
                        expr,
                        SyntaxKind::PreIncrementExpression,
                        &Parser::parseExpressionWithPrecedenceUnary);

        case SyntaxKind::MinusMinusToken:
            return parsePrefixUnaryExpression_AtFirst(
                        expr,
                        SyntaxKind::PreDecrementExpression,
                        &Parser::parseExpressionWithPrecedenceUnary);

        /* 6.5.3.2 */
        case SyntaxKind::AmpersandToken:
            return parsePrefixUnaryExpression_AtFirst(
                        expr,
                        SyntaxKind::AddressOfExpression,
                        &Parser::parseExpressionWithPrecedenceCast);

        case SyntaxKind::AsteriskToken:
            return parsePrefixUnaryExpression_AtFirst(
                        expr,
                        SyntaxKind::PointerIndirectionExpression,
                        &Parser::parseExpressionWithPrecedenceCast);

        /* 6.5.3.3 */
        case SyntaxKind::PlusToken:
            return parsePrefixUnaryExpression_AtFirst(
                        expr,
                        SyntaxKind::UnaryPlusExpression,
                        &Parser::parseExpressionWithPrecedenceCast);

        case SyntaxKind::MinusToken:
            return parsePrefixUnaryExpression_AtFirst(
                        expr,
                        SyntaxKind::UnaryMinusExpression,
                        &Parser::parseExpressionWithPrecedenceCast);

        case SyntaxKind::TildeToken:
            return parsePrefixUnaryExpression_AtFirst(
                        expr,
                        SyntaxKind::BitwiseNotExpression,
                        &Parser::parseExpressionWithPrecedenceCast);

        case SyntaxKind::ExclamationToken:
            return parsePrefixUnaryExpression_AtFirst(
                        expr,
                        SyntaxKind::LogicalNotExpression,
                        &Parser::parseExpressionWithPrecedenceCast);

        /* 6.5.3.4 */
        case SyntaxKind::Keyword_sizeof:
            return parseTypeTraitExpression_AtFirst(expr, SyntaxKind::SizeofExpression);

        case SyntaxKind::Keyword__Alignof:
            return parseTypeTraitExpression_AtFirst(expr, SyntaxKind::AlignofExpression);

        /* GNU labels as values */
        case SyntaxKind::AmpersandAmpersandToken:
            if (!tree_->parseOptions().languageExtensions().isEnabled_extGNU_LabelsAsValues())
                diagReporter_.ExpectedFeature("GNU labels as values");
            return parsePrefixUnaryExpression_AtFirst(
                        expr,
                        SyntaxKind::ExtGNU_LabelAddress,
                        &Parser::parseExpressionWithPrecedenceCast);

        default:
            return parseExpressionWithPrecedencePostfix(expr);
    }
}